

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
presolve::HPresolve::okFromCSC
          (HPresolve *this,vector<double,_std::allocator<double>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar8;
  ulong uVar9;
  HighsLp *pHVar10;
  int iVar11;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  uint uVar12;
  HighsInt dimension;
  int iVar13;
  uint dimension_00;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar14;
  value_type local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  HighsLinearSumBounds *local_38;
  
  pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  piVar4 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  bVar8 = okAssign<int>(&this->colhead,this->model->num_col_,-1);
  if ((bVar8) && (bVar8 = okAssign<int>(&this->rowroot,this->model->num_row_,-1), bVar8)) {
    bVar8 = okAssign<int>(&this->colsize,this->model->num_col_,0);
    if (!bVar8) {
      return false;
    }
    bVar8 = okAssign<int>(&this->rowsize,this->model->num_row_,0);
    if (!bVar8) {
      return false;
    }
    bVar8 = okAssign<int>(&this->rowsizeInteger,this->model->num_row_,0);
    if (!bVar8) {
      return false;
    }
    bVar8 = okAssign<int>(&this->rowsizeImplInt,this->model->num_row_,0);
    if (!bVar8) {
      return false;
    }
    local_48 = &this->Avalue;
    local_40 = &this->Acol;
    HighsLinearSumBounds::setNumSums(&this->impliedRowBounds,0);
    local_38 = &this->impliedDualRowBounds;
    HighsLinearSumBounds::setNumSums(local_38,0);
    pHVar10 = this->model;
    pdVar3 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pHVar10->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->impliedRowBounds).varLower =
         (pHVar10->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->impliedRowBounds).varUpper = pdVar5;
    (this->impliedRowBounds).implVarLower = pdVar3;
    (this->impliedRowBounds).implVarUpper = pdVar6;
    (this->impliedRowBounds).implVarLowerSource = piVar4;
    (this->impliedRowBounds).implVarUpperSource = piVar7;
    HighsLinearSumBounds::setNumSums(&this->impliedRowBounds,pHVar10->num_row_);
    pHVar10 = this->model;
    pdVar3 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->impliedDualRowBounds).varLower =
         (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->impliedDualRowBounds).varUpper = pdVar3;
    (this->impliedDualRowBounds).implVarLower = pdVar5;
    (this->impliedDualRowBounds).implVarUpper = pdVar6;
    (this->impliedDualRowBounds).implVarLowerSource = piVar4;
    (this->impliedDualRowBounds).implVarUpperSource = piVar7;
    HighsLinearSumBounds::setNumSums(local_38,pHVar10->num_col_);
    piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar7 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar9 = (ulong)((long)(Aval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Aval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    std::vector<double,_std::allocator<double>_>::operator=(local_48,Aval);
    dimension = (HighsInt)uVar9;
    bVar8 = okReserve<int>(local_40,dimension);
    if (!bVar8) {
      return false;
    }
    local_48 = (vector<double,_std::allocator<double>_> *)uVar9;
    bVar8 = okReserve<int>(&this->Arow,dimension);
    this_00 = local_40;
    if (bVar8) {
      local_50._M_node._0_4_ = 0;
      iVar11 = (int)local_50._M_node;
      local_50._M_node._0_4_ = 0;
      iVar13 = (int)((ulong)((long)piVar4 - (long)piVar7) >> 2);
      if (iVar13 != 1) {
        do {
          piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<int,_std::allocator<int>_>::_M_fill_insert
                    (this_00,(iterator)
                             (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                     (long)piVar4[(long)(int)local_50._M_node + 1] -
                     (long)piVar4[(int)local_50._M_node],(value_type_conflict2 *)&local_50);
          std::vector<int,std::allocator<int>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ((vector<int,std::allocator<int>> *)&this->Arow,
                     (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start +
                     (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(int)local_50._M_node]);
          local_50._M_node._0_4_ = (int)local_50._M_node + 1;
          iVar11 = (int)local_50._M_node;
        } while ((int)local_50._M_node != iVar13 + -1);
      }
      local_50._M_node._0_4_ = iVar11;
      dimension_00 = (uint)local_48;
      bVar8 = okResize<int>(&this->Anext,dimension_00,0);
      if (!bVar8) {
        return false;
      }
      bVar8 = okResize<int>(&this->Aprev,dimension_00,0);
      if (!bVar8) {
        return false;
      }
      bVar8 = okResize<int>(&this->ARleft,dimension_00,0);
      if (!bVar8) {
        return false;
      }
      bVar8 = okResize<int>(&this->ARright,dimension_00,0);
      if (!bVar8) {
        return false;
      }
      if (dimension_00 != 0) {
        uVar12 = 0;
        __to = extraout_RDX;
        do {
          link(this,(char *)(ulong)uVar12,__to);
          uVar12 = uVar12 + 1;
          __to = extraout_RDX_00;
        } while (dimension_00 != uVar12);
      }
      if ((this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        return true;
      }
      local_50._M_node = &(this->equations)._M_t._M_impl.super__Rb_tree_header._M_header;
      std::
      vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
      ::_M_fill_assign(&this->eqiters,(long)this->model->num_row_,&local_50);
      local_50._M_node = local_50._M_node & 0xffffffff00000000;
      pHVar10 = this->model;
      if (pHVar10->num_row_ == 0) {
        return true;
      }
      iVar11 = 0;
      do {
        dVar2 = (pHVar10->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11];
        pdVar1 = (pHVar10->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar11;
        if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
          pVar14 = std::
                   _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                   ::_M_emplace_unique<int&,int&>
                             ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                               *)&this->equations,
                              (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + iVar11,(int *)&local_50);
          (this->eqiters).
          super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)local_50._M_node]._M_node =
               pVar14.first._M_node._M_node;
          pHVar10 = this->model;
          iVar11 = (int)local_50._M_node;
        }
        iVar11 = iVar11 + 1;
        local_50._M_node._0_4_ = iVar11;
      } while (iVar11 != pHVar10->num_row_);
      return true;
    }
  }
  return false;
}

Assistant:

bool HPresolve::okFromCSC(const std::vector<double>& Aval,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<HighsInt>& Astart) {
  Avalue.clear();
  Acol.clear();
  Arow.clear();

  freeslots.clear();
  if (!okAssign(colhead, model->num_col_, HighsInt{-1})) return false;
  if (!okAssign(rowroot, model->num_row_, HighsInt{-1})) return false;
  if (!okAssign(colsize, model->num_col_)) return false;
  if (!okAssign(rowsize, model->num_row_)) return false;
  if (!okAssign(rowsizeInteger, model->num_row_)) return false;
  if (!okAssign(rowsizeImplInt, model->num_row_)) return false;

  impliedRowBounds.setNumSums(0);
  impliedDualRowBounds.setNumSums(0);
  impliedRowBounds.setBoundArrays(
      model->col_lower_.data(), model->col_upper_.data(), implColLower.data(),
      implColUpper.data(), colLowerSource.data(), colUpperSource.data());
  impliedRowBounds.setNumSums(model->num_row_);
  impliedDualRowBounds.setBoundArrays(
      rowDualLower.data(), rowDualUpper.data(), implRowDualLower.data(),
      implRowDualUpper.data(), rowDualLowerSource.data(),
      rowDualUpperSource.data());
  impliedDualRowBounds.setNumSums(model->num_col_);

  HighsInt ncol = Astart.size() - 1;
  assert(ncol == int(colhead.size()));
  HighsInt nnz = Aval.size();

  Avalue = Aval;
  if (!okReserve(Acol, nnz)) return false;
  if (!okReserve(Arow, nnz)) return false;

  for (HighsInt i = 0; i != ncol; ++i) {
    HighsInt collen = Astart[i + 1] - Astart[i];
    Acol.insert(Acol.end(), collen, i);
    Arow.insert(Arow.end(), Aindex.begin() + Astart[i],
                Aindex.begin() + Astart[i + 1]);
  }

  if (!okResize(Anext, nnz)) return false;
  if (!okResize(Aprev, nnz)) return false;
  if (!okResize(ARleft, nnz)) return false;
  if (!okResize(ARright, nnz)) return false;
  for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);

  if (equations.empty()) {
    try {
      eqiters.assign(model->num_row_, equations.end());
    } catch (const std::bad_alloc& e) {
      printf("HPresolve::okFromCSC eqiters.assign fails with %s\n", e.what());
      return false;
    }
    for (HighsInt i = 0; i != model->num_row_; ++i) {
      // register equation
      if (model->row_lower_[i] == model->row_upper_[i])
        eqiters[i] = equations.emplace(rowsize[i], i).first;
    }
  }
  return true;
}